

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDDMAP mtbdd_map_add(MTBDDMAP map,uint32_t key,MTBDD value)

{
  int iVar1;
  uint32_t var;
  MTBDD MVar2;
  mtbddnode_t n_00;
  MTBDDMAP low_00;
  MTBDDMAP low;
  uint32_t k;
  mtbddnode_t n;
  MTBDD value_local;
  uint32_t key_local;
  MTBDDMAP map_local;
  
  iVar1 = mtbdd_map_isempty(map);
  if (iVar1 == 0) {
    n_00 = MTBDD_GETNODE(map);
    var = mtbddnode_getvariable(n_00);
    if (var < key) {
      MVar2 = mtbddnode_followlow(map,n_00);
      low_00 = mtbdd_map_add(MVar2,key,value);
      MVar2 = mtbddnode_followhigh(map,n_00);
      map_local = mtbdd_makemapnode(var,low_00,MVar2);
    }
    else if (key < var) {
      map_local = mtbdd_makemapnode(key,map,value);
    }
    else {
      MVar2 = mtbddnode_followlow(map,n_00);
      map_local = mtbdd_makemapnode(key,MVar2,value);
    }
  }
  else {
    MVar2 = mtbdd_map_empty();
    map_local = mtbdd_makemapnode(key,MVar2,value);
  }
  return map_local;
}

Assistant:

MTBDDMAP
mtbdd_map_add(MTBDDMAP map, uint32_t key, MTBDD value)
{
    if (mtbdd_map_isempty(map)) {
        return mtbdd_makemapnode(key, mtbdd_map_empty(), value);
    }

    mtbddnode_t n = MTBDD_GETNODE(map);
    uint32_t k = mtbddnode_getvariable(n);

    if (k < key) {
        // add recursively and rebuild tree
        MTBDDMAP low = mtbdd_map_add(node_getlow(map, n), key, value);
        return mtbdd_makemapnode(k, low, node_gethigh(map, n));
    } else if (k > key) {
        return mtbdd_makemapnode(key, map, value);
    } else {
        // replace old
        return mtbdd_makemapnode(key, node_getlow(map, n), value);
    }
}